

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O3

bool __thiscall gimage::TIFFImageIO::handlesFile(TIFFImageIO *this,char *name,bool reading)

{
  long lVar1;
  bool bVar2;
  string s;
  allocator local_31;
  undefined1 *local_30;
  ulong local_28;
  undefined1 local_20 [16];
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  if (local_28 < 5) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x1509a1,0xffffffffffffffff);
    bVar2 = true;
    if (lVar1 != local_28 - 4) {
      lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x150dbb,0xffffffffffffffff);
      if (lVar1 != local_28 - 4) {
        lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x150dc0,0xffffffffffffffff);
        if (lVar1 != local_28 - 5) {
          lVar1 = std::__cxx11::string::rfind((char *)&local_30,0x150dc6,0xffffffffffffffff);
          bVar2 = lVar1 == local_28 - 5;
        }
      }
    }
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return bVar2;
}

Assistant:

bool TIFFImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() < 5)
  {
    return false;
  }

  if (s.rfind(".tif") == s.size()-4 || s.rfind(".TIF") == s.size()-4 ||
    s.rfind(".tiff") == s.size()-5 || s.rfind(".TIFF") == s.size()-5)
  {
    return true;
  }

  return false;
}